

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyPaletted<cBGRA,bCopyAlpha>
               (BYTE *buffer,BYTE *patch,int srcwidth,int srcheight,int Pitch,int step_x,int step_y,
               int rotate,PalEntry *palette,FCopyInfo *inf)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  ulong uVar9;
  int iVar10;
  
  uVar3 = (ulong)(uint)srcheight;
  uVar4 = 0;
  if (srcwidth < 1) {
    srcwidth = 0;
  }
  if (srcheight < 1) {
    uVar3 = 0;
  }
  iVar10 = 0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    lVar7 = (long)iVar10;
    pbVar8 = patch;
    for (uVar9 = 0; (uint)srcwidth != uVar9; uVar9 = uVar9 + 1) {
      bVar1 = *pbVar8;
      bVar2 = palette[bVar1].field_0.field_0.a;
      if (bVar2 != 0) {
        uVar6 = (uint)bVar2;
        uVar5 = uVar6 ^ 0xff;
        buffer[uVar9 * 4 + lVar7 + 2] =
             (BYTE)((ulong)(buffer[uVar9 * 4 + lVar7 + 2] * uVar5 +
                           palette[bVar1].field_0.field_0.r * uVar6) / 0xff);
        buffer[uVar9 * 4 + lVar7 + 1] =
             (BYTE)((ulong)(buffer[uVar9 * 4 + lVar7 + 1] * uVar5 +
                           palette[bVar1].field_0.field_0.g * uVar6) / 0xff);
        buffer[uVar9 * 4 + lVar7] =
             (BYTE)((ulong)(buffer[uVar9 * 4 + lVar7] * uVar5 +
                           palette[bVar1].field_0.field_0.b * uVar6) / 0xff);
        buffer[uVar9 * 4 + lVar7 + 3] = bVar2;
      }
      pbVar8 = pbVar8 + step_x;
    }
    iVar10 = iVar10 + Pitch;
    patch = patch + step_y;
  }
  return;
}

Assistant:

void iCopyPaletted(BYTE *buffer, const BYTE * patch, int srcwidth, int srcheight, int Pitch,
					int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	int x,y,pos;

	for (y=0;y<srcheight;y++)
	{
		pos = y*Pitch;
		for (x=0;x<srcwidth;x++,pos+=4)
		{
			int v=(unsigned char)patch[y*step_y+x*step_x];
			int a = palette[v].a;

			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(buffer[pos + TDest::RED], palette[v].r, a, inf);
				TBlend::OpC(buffer[pos + TDest::GREEN], palette[v].g, a, inf);
				TBlend::OpC(buffer[pos + TDest::BLUE], palette[v].b, a, inf);
				TBlend::OpA(buffer[pos + TDest::ALPHA], a, inf);
			}
		}
	}
}